

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_36::GetEnumValidationRange
               (EnumDescriptor *enum_type,int32_t *first,int32_t *last)

{
  int iVar1;
  int iVar2;
  EnumValueDescriptor *pEVar3;
  long lVar4;
  reference pvVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  EnumDescriptor *local_160;
  ulong local_158;
  int32_t *local_150;
  anon_class_8_1_24043258 val;
  Storage local_140;
  
  if (enum_type->value_count_ + -1 == (int)enum_type->sequential_value_limit_) {
    pEVar3 = EnumDescriptor::value(enum_type,0);
    *first = pEVar3->number_;
    pEVar3 = EnumDescriptor::value(enum_type,enum_type->value_count_ + -1);
    *last = pEVar3->number_;
    bVar11 = true;
  }
  else {
    val.enum_type = &local_160;
    local_160 = enum_type;
    local_150 = last;
    iVar1 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,0);
    iVar10 = local_160->value_count_;
    iVar9 = iVar1;
    for (iVar7 = 1; iVar7 < iVar10; iVar7 = iVar7 + 1) {
      iVar2 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar7);
      if (iVar2 < iVar9) {
        iVar9 = iVar2;
      }
      iVar2 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar7);
      if (iVar1 <= iVar2) {
        iVar1 = iVar2;
      }
    }
    lVar4 = (long)iVar1 - (long)iVar9;
    if (lVar4 < local_160->value_count_) {
      local_158 = lVar4 + 1;
      *first = iVar9;
      *local_150 = iVar1;
      local_140.size_alloc_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
      .super_Storage<unsigned_long,_0UL,_false>.value =
           (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            )((lVar4 + 0x40) / 0x40);
      local_140.data_ =
           absl::lts_20250127::
           FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::
           Storage::InitializeData(&local_140);
      for (lVar4 = 0;
          (long)local_140.size_alloc_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                .super_Storage<unsigned_long,_0UL,_false>.value << 3 != lVar4; lVar4 = lVar4 + 8) {
        *(undefined8 *)((long)local_140.data_ + lVar4) = 0;
      }
      iVar10 = local_160->value_count_;
      uVar8 = 0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      for (iVar7 = 0; iVar10 != iVar7; iVar7 = iVar7 + 1) {
        iVar1 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar7);
        uVar6 = (ulong)(iVar1 - iVar9);
        pvVar5 = absl::lts_20250127::
                 FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::
                 operator[]((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                             *)&local_140,uVar6 >> 6);
        uVar8 = (uVar8 + 1) - (uint)((*pvVar5 >> (uVar6 & 0x3f) & 1) != 0);
        *pvVar5 = *pvVar5 | 1L << (uVar6 & 0x3f);
      }
      bVar11 = local_158 == uVar8;
      absl::lts_20250127::
      FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::Storage::
      ~Storage(&local_140);
    }
    else {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int32_t& first,
                            int32_t& last) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, first, last);
  }

  first = enum_type->value(0)->number();
  last = enum_type->value(enum_type->value_count() - 1)->number();
  return true;
}